

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::returnConn(WebServer *this,HttpConnPtr *conn)

{
  EventLoop *this_00;
  _Bind<void_(WebServer::*(WebServer_*,_std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>
  local_60;
  Functor local_38;
  
  this_00 = this->loop_;
  local_60._M_f = (offset_in_WebServer_to_subr)returnConnInLoop;
  local_60._8_8_ = 0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_WebServer_*,_std::shared_ptr<HttpConn>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<HttpConn>_>.
  super__Head_base<1UL,_std::shared_ptr<HttpConn>,_false>._M_head_impl.
  super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60._M_bound_args.super__Tuple_impl<0UL,_WebServer_*,_std::shared_ptr<HttpConn>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<HttpConn>_>.
  super__Head_base<1UL,_std::shared_ptr<HttpConn>,_false>._M_head_impl.
  super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_WebServer_*,_std::shared_ptr<HttpConn>_>.
  super__Head_base<0UL,_WebServer_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(WebServer::*(WebServer*,std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>,void>
            ((function<void()> *)&local_38,&local_60);
  EventLoop::runInLoop(this_00,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_60._M_bound_args.
                     super__Tuple_impl<0UL,_WebServer_*,_std::shared_ptr<HttpConn>_>.
                     super__Tuple_impl<1UL,_std::shared_ptr<HttpConn>_>.
                     super__Head_base<1UL,_std::shared_ptr<HttpConn>,_false>._M_head_impl + 8));
  return;
}

Assistant:

void WebServer::returnConn(HttpConnPtr conn) {
    loop_->runInLoop(std::bind(&WebServer::returnConnInLoop, this, std::move(conn)));
}